

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O1

ostream * operator<<(ostream *out,Person *p)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Person{ age: ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<(out,p->age);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", name: ",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(p->name)._M_dataplus._M_p,(p->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," }",2);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Person& p)
{
  return out << "Person{ age: " << p.age << ", name: " << p.name << " }";
}